

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

OneStepDelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OneStepDelaySyntax,slang::syntax::OneStepDelaySyntax_const&>
          (BumpAllocator *this,OneStepDelaySyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  OneStepDelaySyntax *pOVar13;
  
  pOVar13 = (OneStepDelaySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OneStepDelaySyntax *)this->endPtr < pOVar13 + 1) {
    pOVar13 = (OneStepDelaySyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pOVar13 + 1);
  }
  (pOVar13->oneStep).info = (args->oneStep).info;
  SVar11 = (args->super_TimingControlSyntax).super_SyntaxNode.kind;
  uVar12 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingControlSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_TimingControlSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->hash).kind;
  uVar8 = (args->hash).field_0x2;
  NVar9.raw = (args->hash).numFlags.raw;
  uVar10 = (args->hash).rawLen;
  TVar3 = (args->oneStep).kind;
  uVar4 = (args->oneStep).field_0x2;
  NVar5.raw = (args->oneStep).numFlags.raw;
  uVar6 = (args->oneStep).rawLen;
  (pOVar13->hash).info = (args->hash).info;
  (pOVar13->oneStep).kind = TVar3;
  (pOVar13->oneStep).field_0x2 = uVar4;
  (pOVar13->oneStep).numFlags = (NumericTokenFlags)NVar5.raw;
  (pOVar13->oneStep).rawLen = uVar6;
  (pOVar13->super_TimingControlSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pOVar13->hash).kind = TVar7;
  (pOVar13->hash).field_0x2 = uVar8;
  (pOVar13->hash).numFlags = (NumericTokenFlags)NVar9.raw;
  (pOVar13->hash).rawLen = uVar10;
  (pOVar13->super_TimingControlSyntax).super_SyntaxNode.kind = SVar11;
  *(undefined4 *)&(pOVar13->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar12;
  (pOVar13->super_TimingControlSyntax).super_SyntaxNode.parent = pSVar1;
  return pOVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }